

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator::GenerateBuilderMembers
          (RepeatedImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_GETTER,false);
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public java.util.List<$type$> ${$get$capitalized_name$List$}$() {\n  return instance.get$capitalized_name$List();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_COUNT,false);
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return instance.get$capitalized_name$Count();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_INDEXED_GETTER,false);
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n  return instance.get$capitalized_name$(index);\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_INDEXED_SETTER,true);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    int index, $type$ value) {\n  copyOnWrite();\n  instance.set$capitalized_name$(index, value);\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_ADDER,true);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder ${$add$capitalized_name$$}$($type$ value) {\n  copyOnWrite();\n  instance.add$capitalized_name$(value);\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_MULTI_ADDER,true);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder ${$addAll$capitalized_name$$}$(\n    java.lang.Iterable<? extends $type$> values) {\n  copyOnWrite();\n  instance.addAll$capitalized_name$(values);  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldAccessorDocComment(printer,this->descriptor_,CLEARER,true);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  copyOnWrite();\n  instance.clear$capitalized_name$();\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  if (*(int *)(*(long *)(this->descriptor_ + 0x28) + 0x3c) == 3) {
    WriteFieldEnumValueAccessorDocComment(printer,this->descriptor_,LIST_GETTER,false);
    io::Printer::Print(printer,variables,
                       "@java.lang.Override\n$deprecation$public java.util.List<java.lang.Integer>\n${$get$capitalized_name$ValueList$}$() {\n  return java.util.Collections.unmodifiableList(\n      instance.get$capitalized_name$ValueList());\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer,this->descriptor_,LIST_INDEXED_GETTER,false);
    io::Printer::Print(printer,variables,
                       "@java.lang.Override\n$deprecation$public int ${$get$capitalized_name$Value$}$(int index) {\n  return instance.get$capitalized_name$Value(index);\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer,this->descriptor_,LIST_INDEXED_SETTER,true);
    io::Printer::Print(printer,variables,
                       "$deprecation$public Builder ${$set$capitalized_name$Value$}$(\n    int index, int value) {\n  copyOnWrite();\n  instance.set$capitalized_name$Value(index, value);\n  return this;\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer,this->descriptor_,LIST_ADDER,true);
    io::Printer::Print(printer,variables,
                       "$deprecation$public Builder ${$add$capitalized_name$Value$}$(int value) {\n  instance.add$capitalized_name$Value(value);\n  return this;\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer,this->descriptor_,LIST_MULTI_ADDER,true);
    io::Printer::Print(printer,variables,
                       "$deprecation$public Builder ${$addAll$capitalized_name$Value$}$(\n    java.lang.Iterable<java.lang.Integer> values) {\n  copyOnWrite();\n  instance.addAll$capitalized_name$Value(values);\n  return this;\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
    return;
  }
  return;
}

Assistant:

void RepeatedImmutableEnumFieldLiteGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public java.util.List<$type$> "
                 "${$get$capitalized_name$List$}$() {\n"
                 "  return instance.get$capitalized_name$List();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT);
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return instance.get$capitalized_name$Count();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER);
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n"
      "  return instance.get$capitalized_name$(index);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_SETTER,
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
                 "    int index, $type$ value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.set$capitalized_name$(index, value);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_ADDER,
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder "
                 "${$add$capitalized_name$$}$($type$ value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.add$capitalized_name$(value);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_MULTI_ADDER,
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$addAll$capitalized_name$$}$(\n"
                 "    java.lang.Iterable<? extends $type$> values) {\n"
                 "  copyOnWrite();\n"
                 "  instance.addAll$capitalized_name$(values);"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  copyOnWrite();\n"
      "  instance.clear$capitalized_name$();\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, LIST_GETTER);
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$public java.util.List<java.lang.Integer>\n"
                   "${$get$capitalized_name$ValueList$}$() {\n"
                   "  return java.util.Collections.unmodifiableList(\n"
                   "      instance.get$capitalized_name$ValueList());\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_,
                                          LIST_INDEXED_GETTER);
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$public int "
                   "${$get$capitalized_name$Value$}$(int index) {\n"
                   "  return instance.get$capitalized_name$Value(index);\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_,
                                          LIST_INDEXED_SETTER,
                                          /* builder */ true);
    printer->Print(
        variables_,
        "$deprecation$public Builder ${$set$capitalized_name$Value$}$(\n"
        "    int index, int value) {\n"
        "  copyOnWrite();\n"
        "  instance.set$capitalized_name$Value(index, value);\n"
        "  return this;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, LIST_ADDER,
                                          /* builder */ true);
    printer->Print(variables_,
                   "$deprecation$public Builder "
                   "${$add$capitalized_name$Value$}$(int value) {\n"
                   "  instance.add$capitalized_name$Value(value);\n"
                   "  return this;\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_,
                                          LIST_MULTI_ADDER,
                                          /* builder */ true);
    printer->Print(
        variables_,
        "$deprecation$public Builder ${$addAll$capitalized_name$Value$}$(\n"
        "    java.lang.Iterable<java.lang.Integer> values) {\n"
        "  copyOnWrite();\n"
        "  instance.addAll$capitalized_name$Value(values);\n"
        "  return this;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }
}